

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

Field __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSubField
          (HeapTypeGeneratorImpl *this,Field super)

{
  bool bVar1;
  Field FVar2;
  undefined1 local_28 [8];
  Field super_local;
  
  super_local.type.id = super._8_8_;
  local_28 = (undefined1  [8])super.type.id;
  if ((super.mutable_ != Mutable) && (bVar1 = Field::isPacked((Field *)local_28), !bVar1)) {
    local_28 = (undefined1  [8])generateSubtype(this,(Type)local_28);
    super_local.type.id = 0;
  }
  FVar2.packedType = (int)super_local.type.id;
  FVar2.mutable_ = (int)(super_local.type.id >> 0x20);
  FVar2.type.id = (uintptr_t)local_28;
  return FVar2;
}

Assistant:

Field generateSubField(Field super) {
    if (super.mutable_ == Mutable) {
      // Only immutable fields support subtyping.
      return super;
    }
    if (super.isPacked()) {
      // No other subtypes of i8 or i16.
      return super;
    }
    return {generateSubtype(super.type), Immutable};
  }